

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_aes_decrypt.c
# Opt level: O2

int tc_aes_decrypt(uint8_t *out,uint8_t *in,TCAesKeySched_t s)

{
  EVP_PKEY_CTX *dst;
  int iVar1;
  long lVar2;
  uint8_t local_58 [4];
  uint8_t local_54 [4];
  uint8_t t [16];
  uint8_t state [16];
  
  iVar1 = 0;
  if (s != (TCAesKeySched_t)0x0 && (in != (uint8_t *)0x0 && out != (uint8_t *)0x0)) {
    dst = (EVP_PKEY_CTX *)(t + 8);
    _copy(dst,(EVP_PKEY_CTX *)0x10);
    add_round_key((uint8_t *)dst,s->words + 0x28);
    lVar2 = 0x90;
    while( true ) {
      inv_shift_rows((uint8_t *)dst);
      inv_sub_bytes((uint8_t *)dst);
      if (lVar2 == 0) break;
      add_round_key((uint8_t *)dst,(uint *)((long)s->words + lVar2));
      mult_row_column(local_58,(uint8_t *)dst);
      mult_row_column(local_54,t + 0xc);
      mult_row_column(t,state);
      mult_row_column(t + 4,state + 4);
      _copy(dst,(EVP_PKEY_CTX *)0x10);
      lVar2 = lVar2 + -0x10;
    }
    add_round_key(t + 8,s->words);
    _copy((EVP_PKEY_CTX *)out,(EVP_PKEY_CTX *)0x10);
    _set(t + 8,'\0',0x10);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int tc_aes_decrypt(uint8_t *out, const uint8_t *in, const TCAesKeySched_t s)
{
	uint8_t state[Nk*Nb];
	unsigned int i;

	if (out == (uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	} else if (in == (const uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	} else if (s == (TCAesKeySched_t) 0) {
		return TC_CRYPTO_FAIL;
	}

	(void)_copy(state, sizeof(state), in, sizeof(state));

	add_round_key(state, s->words + Nb*Nr);

	for (i = Nr - 1; i > 0; --i) {
		inv_shift_rows(state);
		inv_sub_bytes(state);
		add_round_key(state, s->words + Nb*i);
		inv_mix_columns(state);
	}

	inv_shift_rows(state);
	inv_sub_bytes(state);
	add_round_key(state, s->words);

	(void)_copy(out, sizeof(state), state, sizeof(state));

	/*zeroing out the state buffer */
	_set(state, TC_ZERO_BYTE, sizeof(state));


	return TC_CRYPTO_SUCCESS;
}